

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pstack::Elf::Object::findSymbolByAddress_abi_cxx11_
          (optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Object *this,Addr addr,int type)

{
  bool bVar1;
  SymbolSection *pSVar2;
  Section *this_00;
  element_type *this_01;
  pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  byte local_17a;
  undefined1 local_179;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  shared_ptr<const_pstack::LzmaReader> reader;
  string local_140;
  Section *local_120;
  Section *gnu_debugdata;
  uint local_dc;
  pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  Object *local_90;
  anon_class_48_6_dc1cbea5 findSym;
  string name;
  Sym sym;
  bool haveExactZeroSizeMatch;
  Addr AStack_20;
  int type_local;
  Addr addr_local;
  Object *this_local;
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *debugSym;
  
  sym.st_size._3_1_ = 0;
  sym.st_size._4_4_ = type;
  AStack_20 = addr;
  addr_local = (Addr)this;
  this_local = (Object *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&findSym.haveExactZeroSizeMatch);
  findSym.this = (Object *)((long)&sym.st_size + 4);
  findSym.type = (int *)&stack0xffffffffffffffe0;
  findSym.addr = (Addr *)(name.field_2._M_local_buf + 8);
  findSym.name = (string *)((long)&sym.st_size + 3);
  local_90 = this;
  findSym.sym = (Sym *)&findSym.haveExactZeroSizeMatch;
  pSVar2 = debugSymbols(this);
  bVar1 = findSymbolByAddress[abi:cxx11](unsigned_long,int)::$_0::operator()
                    ((__0 *)&local_90,pSVar2);
  if (bVar1) {
    std::make_pair<Elf64_Sym&,std::__cxx11::string&>
              (&local_d8,(value_type *)((long)&name.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &findSym.haveExactZeroSizeMatch);
    std::
    optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              (__return_storage_ptr__,&local_d8);
    std::
    pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_d8);
    local_dc = 1;
  }
  else {
    pSVar2 = dynamicSymbols(this);
    bVar1 = findSymbolByAddress[abi:cxx11](unsigned_long,int)::$_0::operator()
                      ((__0 *)&local_90,pSVar2);
    if (bVar1) {
      std::make_pair<Elf64_Sym&,std::__cxx11::string&>
                ((pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gnu_debugdata,(value_type *)((long)&name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &findSym.haveExactZeroSizeMatch);
      std::
      optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::
      optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                (__return_storage_ptr__,
                 (pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gnu_debugdata);
      std::
      pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gnu_debugdata);
      local_dc = 1;
    }
    else {
      bVar1 = std::operator==(&this->debugData,(nullptr_t)0x0);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,".gnu_debugdata",
                   (allocator<char> *)
                   ((long)&reader.
                           super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        this_00 = getSection(this,&local_140,1);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&reader.
                           super___shared_ptr<const_pstack::LzmaReader,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        local_120 = this_00;
        bVar1 = Section::operator_cast_to_bool(this_00);
        if (bVar1) {
          Section::io((Section *)local_168);
          std::make_shared<pstack::LzmaReader_const,std::shared_ptr<pstack::Reader_const>>
                    ((shared_ptr<const_pstack::Reader> *)local_158);
          std::shared_ptr<const_pstack::Reader>::~shared_ptr
                    ((shared_ptr<const_pstack::Reader> *)local_168);
          local_179 = 1;
          std::
          make_shared<pstack::Elf::Object,pstack::Context&,std::shared_ptr<pstack::LzmaReader_const>&,bool>
                    ((Context *)local_178,(shared_ptr<const_pstack::LzmaReader> *)this->context,
                     (bool *)local_158);
          std::shared_ptr<pstack::Elf::Object>::operator=
                    (&this->debugData,(shared_ptr<pstack::Elf::Object> *)local_178);
          std::shared_ptr<pstack::Elf::Object>::~shared_ptr
                    ((shared_ptr<pstack::Elf::Object> *)local_178);
          std::shared_ptr<const_pstack::LzmaReader>::~shared_ptr
                    ((shared_ptr<const_pstack::LzmaReader> *)local_158);
        }
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->debugData);
      if (bVar1) {
        local_17a = 0;
        this_01 = std::
                  __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->debugData);
        findSymbolByAddress_abi_cxx11_(__return_storage_ptr__,this_01,AStack_20,sym.st_size._4_4_);
        bVar1 = std::optional::operator_cast_to_bool((optional *)__return_storage_ptr__);
        if (bVar1) {
          local_17a = 1;
        }
        local_dc = (uint)bVar1;
        if ((local_17a & 1) == 0) {
          std::
          optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~optional(__return_storage_ptr__);
        }
        if (local_dc != 0) goto LAB_002853a9;
      }
      if ((sym.st_size._3_1_ & 1) == 0) {
        name.field_2._14_2_ = 0;
        std::
        optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::optional(__return_storage_ptr__);
        local_dc = 1;
      }
      else {
        std::make_pair<Elf64_Sym&,std::__cxx11::string&>
                  (&local_1b8,(value_type *)((long)&name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &findSym.haveExactZeroSizeMatch);
        std::
        optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::
        optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  (__return_storage_ptr__,&local_1b8);
        std::
        pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_1b8);
        local_dc = 1;
      }
    }
  }
LAB_002853a9:
  std::__cxx11::string::~string((string *)&findSym.haveExactZeroSizeMatch);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<Sym, string>>
Object::findSymbolByAddress(Addr addr, int type)
{
    /* Try to find symbols in these sections */
    bool haveExactZeroSizeMatch = false;

    Sym sym;
    std::string name;
    auto findSym = [&] (auto &table) {
        for (const auto &candidate : table) {
            if (candidate.st_shndx >= sectionHeaders.size())
                continue;
            if (type != STT_NOTYPE && ELF_ST_TYPE(candidate.st_info) != type)
                continue;
            if (candidate.st_value > addr)
                continue;
            if (candidate.st_size + candidate.st_value <= addr) {
                if (candidate.st_size == 0 && candidate.st_value == addr) {
                    sym = candidate;
                    name = table.name(candidate);
                    haveExactZeroSizeMatch = true;
                }
                continue;
            }
            auto &sec = sectionHeaders[candidate.st_shndx];
            if ((sec->shdr.sh_flags & SHF_ALLOC) == 0)
                continue;
            sym = candidate;
            name = table.name(candidate);
            return true;
        }
        sym.st_shndx = SHN_UNDEF;
        return false;
    };
    if (findSym(*debugSymbols()))
        return std::make_pair( sym, name );
    if (findSym(*dynamicSymbols()))
        return std::make_pair( sym, name );
    // .gnu_debugdata is a separate LZMA-compressed ELF image with just
    // a symbol table.
    if (debugData == nullptr) {
#ifdef WITH_LZMA
        auto &gnu_debugdata = getSection(".gnu_debugdata", SHT_PROGBITS );
        if (gnu_debugdata) {
           auto reader = make_shared<const LzmaReader>(gnu_debugdata.io());
           debugData = make_shared<Object>(context, reader, true);
        }
#else
        static bool warned = false;
        if (!warned && context.debug) {
            *context.debug << "warning: no compiled support for LZMA - "
                "can't decode debug data in " << *io << "\n";
            warned = true;
        }
#endif
    }

    if (debugData) {
        auto debugSym = debugData->findSymbolByAddress(addr, type);
        if (debugSym)
            return debugSym;
    }

    if (haveExactZeroSizeMatch)
        return std::make_pair( sym, name );
    sym.st_shndx = SHN_UNDEF;
    return std::nullopt;
}